

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

int exp1(LexState *ls,Fornuminfo *info)

{
  int iVar1;
  expkind eVar2;
  int expect_int;
  int reg;
  expdesc e;
  Fornuminfo *info_local;
  LexState *ls_local;
  
  e._48_8_ = info;
  memset(&expect_int,0,0x38);
  e.t = -1;
  e.usertype._0_4_ = 0xffffffff;
  iVar1 = (ls->t).token;
  expr(ls,(expdesc *)&expect_int);
  if ((ravi_parser_debug & 1U) != 0) {
    raviY_printf(ls->fs,"fornum exp -> %e\n",&expect_int);
  }
  *(uint *)(e._48_8_ + 4) = (uint)(expect_int == 6);
  eVar2 = e.k;
  if (*(int *)(e._48_8_ + 4) == 0) {
    eVar2 = VVOID;
  }
  *(expkind *)(e._48_8_ + 8) = eVar2;
  luaK_exp2nextreg(ls->fs,(expdesc *)&expect_int);
  if (expect_int == 7) {
    if ((iVar1 == 0x23) && (e.t != 8)) {
      luaK_codeABC(ls->fs,OP_RAVI_TOINT,e.k,0,0);
      *(undefined4 *)e._48_8_ = 8;
    }
    else {
      *(int *)e._48_8_ = e.t;
    }
    return e.k;
  }
  __assert_fail("e.k == VNONRELOC",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                ,0x80c,"int exp1(LexState *, Fornuminfo *)");
}

Assistant:

static int exp1 (LexState *ls, Fornuminfo *info) {
  /* Since the local variable in a fornum loop is local to the loop and does
   * not use any variable in outer scope we don't need to check its
   * type - also the loop is already optimised so no point trying to
   * optimise the iteration variable
   */
  expdesc e = {.ravi_type_map = RAVI_TM_ANY, .pc = -1};
  int reg;
  int expect_int = 0;
  if (ls->t.token == '#')
    expect_int = 1;
  expr(ls, &e);
  DEBUG_EXPR(raviY_printf(ls->fs, "fornum exp -> %e\n", &e));
  info->is_constant = (e.k == VKINT);
  info->int_value = info->is_constant ? e.u.ival : 0;
  luaK_exp2nextreg(ls->fs, &e);
  lua_assert(e.k == VNONRELOC);
  reg = e.u.info;
  if (expect_int && e.ravi_type_map != RAVI_TM_INTEGER) {
    luaK_codeABC(ls->fs, OP_RAVI_TOINT, reg, 0, 0);
    info->type_map = RAVI_TM_INTEGER;
  }
  else {
    info->type_map = e.ravi_type_map;
  }
  return reg;
}